

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O0

void construct_SA(sauchar_t *T,saidx_t *SA,saidx_t *bucket_A,saidx_t *bucket_B,saidx_t n,saidx_t m)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint local_54;
  saint_t c2;
  saint_t c1;
  saint_t c0;
  saidx_t s;
  saidx_t *k;
  saidx_t *j;
  saidx_t *i;
  saidx_t m_local;
  saidx_t n_local;
  saidx_t *bucket_B_local;
  saidx_t *bucket_A_local;
  saidx_t *SA_local;
  sauchar_t *T_local;
  
  if (0 < m) {
    for (c1 = 0xfe; -1 < c1; c1 = c1 + -1) {
      iVar1 = bucket_B[(int)(c1 << 8 | c1 + 1U)];
      j = SA + bucket_A[c1 + 1];
      k = (saidx_t *)0x0;
      c2 = -1;
      while (j = j + -1, SA + iVar1 <= j) {
        uVar2 = *j;
        if ((int)uVar2 < 1) {
          *j = uVar2 ^ 0xffffffff;
        }
        else {
          *j = uVar2 ^ 0xffffffff;
          s = uVar2 - 1;
          uVar3 = (uint)T[s];
          if ((0 < s) && (uVar3 < T[(int)(uVar2 - 2)])) {
            s = s ^ 0xffffffff;
          }
          if (uVar3 != c2) {
            if (-1 < c2) {
              bucket_B[c1 << 8 | c2] = (saidx_t)((long)k - (long)SA >> 2);
            }
            k = SA + bucket_B[(int)(c1 << 8 | uVar3)];
            c2 = uVar3;
          }
          *k = s;
          k = k + -1;
        }
      }
    }
  }
  c2 = (saint_t)T[n + -1];
  if ((uint)T[n + -2] < (uint)c2) {
    local_54 = n - 1U ^ 0xffffffff;
  }
  else {
    local_54 = n - 1;
  }
  k = SA + bucket_A[c2] + 1;
  SA[bucket_A[c2]] = local_54;
  for (i = SA; i < SA + n; i = i + 1) {
    uVar2 = *i;
    if ((int)uVar2 < 1) {
      *i = uVar2 ^ 0xffffffff;
    }
    else {
      s = uVar2 - 1;
      uVar3 = (uint)T[s];
      if ((s == 0) || (T[(int)(uVar2 - 2)] < uVar3)) {
        s = s ^ 0xffffffff;
      }
      if (uVar3 != c2) {
        bucket_A[c2] = (saidx_t)((long)k - (long)SA >> 2);
        k = SA + bucket_A[(int)uVar3];
        c2 = uVar3;
      }
      *k = s;
      k = k + 1;
    }
  }
  return;
}

Assistant:

static
void
construct_SA(const sauchar_t *T, saidx_t *SA,
             saidx_t *bucket_A, saidx_t *bucket_B,
             saidx_t n, saidx_t m) {
  saidx_t *i, *j, *k;
  saidx_t s;
  saint_t c0, c1, c2;

  if(0 < m) {
    /* Construct the sorted order of type B suffixes by using
       the sorted order of type B* suffixes. */
    for(c1 = ALPHABET_SIZE - 2; 0 <= c1; --c1) {
      /* Scan the suffix array from right to left. */
      for(i = SA + BUCKET_BSTAR(c1, c1 + 1),
          j = SA + BUCKET_A(c1 + 1) - 1, k = NULL, c2 = -1;
          i <= j;
          --j) {
        if(0 < (s = *j)) {
          assert(T[s] == c1);
          assert(((s + 1) < n) && (T[s] <= T[s + 1]));
          assert(T[s - 1] <= T[s]);
          *j = ~s;
          c0 = T[--s];
          if((0 < s) && (T[s - 1] > c0)) { s = ~s; }
          if(c0 != c2) {
            if(0 <= c2) { BUCKET_B(c2, c1) = k - SA; }
            k = SA + BUCKET_B(c2 = c0, c1);
          }
          assert(k < j);
          *k-- = s;
        } else {
          assert(((s == 0) && (T[s] == c1)) || (s < 0));
          *j = ~s;
        }
      }
    }
  }

  /* Construct the suffix array by using
     the sorted order of type B suffixes. */
  k = SA + BUCKET_A(c2 = T[n - 1]);
  *k++ = (T[n - 2] < c2) ? ~(n - 1) : (n - 1);
  /* Scan the suffix array from left to right. */
  for(i = SA, j = SA + n; i < j; ++i) {
    if(0 < (s = *i)) {
      assert(T[s - 1] >= T[s]);
      c0 = T[--s];
      if((s == 0) || (T[s - 1] < c0)) { s = ~s; }
      if(c0 != c2) {
        BUCKET_A(c2) = k - SA;
        k = SA + BUCKET_A(c2 = c0);
      }
      assert(i < k);
      *k++ = s;
    } else {
      assert(s < 0);
      *i = ~s;
    }
  }
}